

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

TextureCubemap * LoadTextureCubemap(TextureCubemap *__return_storage_ptr__,Image image,int layout)

{
  undefined1 auVar1 [16];
  Image src;
  Image image_00;
  Image image_01;
  int iVar2;
  long lVar3;
  float *pfVar4;
  int i;
  int iVar5;
  ulong uVar6;
  int iVar7;
  undefined8 *puVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  Rectangle srcRec;
  Image mipmapped;
  undefined1 local_f8 [28];
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uVar12;
  float fVar13;
  undefined8 uVar14;
  Image local_70;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  iVar5 = layout;
  switch(layout) {
  case 0:
    if (image.height < image.width) {
      iVar2 = image.width / 6;
      layout = 2;
      if (iVar2 != image.height) {
        iVar2 = image.width + 3;
        if (-1 < image.width) {
          iVar2 = image.width;
        }
        iVar2 = iVar2 >> 2;
        layout = 4;
        iVar5 = 0;
        if (iVar2 != image.height / 3) goto switchD_0019c84f_default;
      }
    }
    else {
      iVar5 = 0;
      if (image.height <= image.width) goto switchD_0019c84f_default;
      iVar2 = image.height / 6;
      layout = 1;
      if (iVar2 != image.width) {
        iVar2 = image.width / 3;
        iVar7 = image.height + 3;
        if (-1 < image.height) {
          iVar7 = image.height;
        }
        layout = 3;
        if (iVar2 != iVar7 >> 2) goto switchD_0019c84f_default;
      }
    }
    break;
  case 1:
    image.width = image.height;
    goto LAB_0019c8e3;
  case 2:
LAB_0019c8e3:
    iVar2 = image.width / 6 + (image.width >> 0x1f);
LAB_0019c8ea:
    iVar2 = iVar2 - (iVar2 >> 0x1f);
    break;
  case 3:
    iVar2 = image.width / 3 + (image.width >> 0x1f);
    goto LAB_0019c8ea;
  case 4:
    iVar2 = image.width + 3;
    if (-1 < image.width) {
      iVar2 = image.width;
    }
    iVar2 = iVar2 >> 2;
    layout = 4;
    break;
  default:
    goto switchD_0019c84f_default;
  }
  __return_storage_ptr__->width = iVar2;
  iVar5 = layout;
switchD_0019c84f_default:
  iVar2 = __return_storage_ptr__->width;
  __return_storage_ptr__->height = iVar2;
  if (iVar5 == 0) {
    TraceLog(4,"IMAGE: Failed to detect cubemap image layout");
    return __return_storage_ptr__;
  }
  local_f8._0_8_ = (void *)0x0;
  local_f8._8_4_ = 0;
  local_f8._12_4_ = 0;
  local_f8._16_4_ = 0;
  local_f8._20_4_ = 0;
  fVar13 = 0.0;
  fVar11 = 0.0;
  uVar14 = 0;
  local_d8 = 0;
  uVar12 = 0;
  fVar10 = (float)iVar2;
  lVar3 = 0xc;
  do {
    *(undefined8 *)(local_f8 + lVar3 + 0x14) = 0;
    *(float *)((long)&fStack_dc + lVar3) = fVar10;
    *(float *)((long)&local_d8 + lVar3) = fVar10;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x6c);
  switch(iVar5) {
  case 1:
    image_00.width = (int)fVar13;
    image_00.data = (void *)uVar12;
    image_00.height = (int)fVar11;
    image_00.mipmaps = (int)uVar14;
    image_00.format = (int)((ulong)uVar14 >> 0x20);
    ImageCopy(image_00);
    goto LAB_0019cbd9;
  case 2:
    pfVar4 = (float *)&local_d8;
    lVar3 = 0;
    do {
      *pfVar4 = (float)(int)lVar3 * (float)iVar2;
      lVar3 = lVar3 + 1;
      pfVar4 = pfVar4 + 4;
    } while (lVar3 != 6);
    break;
  case 3:
    fVar13 = (float)iVar2;
    local_d8 = CONCAT44(fVar13,fVar13);
    fVar11 = fVar13 * 3.0;
    break;
  case 4:
    local_d8 = CONCAT44(fVar10,fVar10 + fVar10);
    fVar13 = 0.0;
    fVar11 = fVar10;
  }
  uVar9 = iVar2 * 6 * iVar2;
  local_f8._0_8_ = calloc((long)(int)uVar9,4);
  if (0 < (int)uVar9) {
    uVar6 = 0;
    do {
      *(undefined4 *)(local_f8._0_8_ + uVar6 * 4) = 0xffff00ff;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
  local_f8._12_4_ = iVar2 * 6;
  local_f8._8_4_ = iVar2;
  local_f8._16_4_ = 1;
  local_f8._20_4_ = 7;
  ImageFormat((Image *)local_f8,image.format);
  image_01.width = (int)fVar13;
  image_01.data = (void *)uVar12;
  image_01.height = (int)fVar11;
  image_01.mipmaps = (int)uVar14;
  image_01.format = (int)((ulong)uVar14 >> 0x20);
  ImageCopy(image_01);
  ImageMipmaps(&local_70);
  ImageMipmaps((Image *)local_f8);
  local_58 = (float)iVar2;
  local_48 = ZEXT416((uint)local_58);
  fStack_54 = local_58;
  fStack_50 = local_58;
  fStack_4c = local_58;
  puVar8 = (undefined8 *)&stack0xffffffffffffff30;
  lVar3 = 0;
  do {
    auVar1._8_4_ = fStack_54;
    auVar1._4_4_ = local_58;
    src.width = local_70.width;
    src.height = local_70.height;
    src.data = local_70.data;
    src.mipmaps = local_70.mipmaps;
    src.format = local_70.format;
    srcRec._8_8_ = *puVar8;
    srcRec._0_8_ = puVar8[-1];
    auVar1._0_4_ = (float)(int)lVar3 * (float)local_48._0_4_;
    auVar1._12_4_ = 0;
    ImageDraw((Image *)local_f8,src,srcRec,(Rectangle)(auVar1 << 0x20),(Color)0xffffffff);
    lVar3 = lVar3 + 1;
    puVar8 = puVar8 + 2;
  } while (lVar3 != 6);
  free(local_70.data);
LAB_0019cbd9:
  uVar9 = rlLoadTextureCubemap((void *)local_f8._0_8_,iVar2,local_f8._20_4_,local_f8._16_4_);
  __return_storage_ptr__->id = uVar9;
  if (uVar9 == 0) {
    TraceLog(4,"IMAGE: Failed to load cubemap image");
  }
  else {
    __return_storage_ptr__->format = local_f8._20_4_;
    __return_storage_ptr__->mipmaps = 1;
  }
  free((void *)local_f8._0_8_);
  return __return_storage_ptr__;
}

Assistant:

TextureCubemap LoadTextureCubemap(Image image, int layout)
{
    TextureCubemap cubemap = { 0 };

    if (layout == CUBEMAP_LAYOUT_AUTO_DETECT)      // Try to automatically guess layout type
    {
        // Check image width/height to determine the type of cubemap provided
        if (image.width > image.height)
        {
            if ((image.width/6) == image.height) { layout = CUBEMAP_LAYOUT_LINE_HORIZONTAL; cubemap.width = image.width/6; }
            else if ((image.width/4) == (image.height/3)) { layout = CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE; cubemap.width = image.width/4; }
        }
        else if (image.height > image.width)
        {
            if ((image.height/6) == image.width) { layout = CUBEMAP_LAYOUT_LINE_VERTICAL; cubemap.width = image.height/6; }
            else if ((image.width/3) == (image.height/4)) { layout = CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR; cubemap.width = image.width/3; }
        }
    }
    else
    {
        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL) cubemap.width = image.height/6;
        if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) cubemap.width = image.width/6;
        if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR) cubemap.width = image.width/3;
        if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE) cubemap.width = image.width/4;
    }

    cubemap.height = cubemap.width;

    // Layout provided or already auto-detected
    if (layout != CUBEMAP_LAYOUT_AUTO_DETECT)
    {
        int size = cubemap.width;

        Image faces = { 0 };                // Vertical column image
        Rectangle faceRecs[6] = { 0 };      // Face source rectangles

        for (int i = 0; i < 6; i++) faceRecs[i] = (Rectangle){ 0, 0, (float)size, (float)size };

        if (layout == CUBEMAP_LAYOUT_LINE_VERTICAL)
        {
            faces = ImageCopy(image);       // Image data already follows expected convention
        }
        /*else if (layout == CUBEMAP_LAYOUT_PANORAMA)
        {
            // TODO: implement panorama by converting image to square faces...
            // Ref: https://github.com/denivip/panorama/blob/master/panorama.cpp
        } */
        else
        {
            if (layout == CUBEMAP_LAYOUT_LINE_HORIZONTAL) for (int i = 0; i < 6; i++) faceRecs[i].x = (float)size*i;
            else if (layout == CUBEMAP_LAYOUT_CROSS_THREE_BY_FOUR)
            {
                faceRecs[0].x = (float)size; faceRecs[0].y = (float)size;
                faceRecs[1].x = (float)size; faceRecs[1].y = (float)size*3;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = 0; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*2; faceRecs[5].y = (float)size;
            }
            else if (layout == CUBEMAP_LAYOUT_CROSS_FOUR_BY_THREE)
            {
                faceRecs[0].x = (float)size*2; faceRecs[0].y = (float)size;
                faceRecs[1].x = 0; faceRecs[1].y = (float)size;
                faceRecs[2].x = (float)size; faceRecs[2].y = 0;
                faceRecs[3].x = (float)size; faceRecs[3].y = (float)size*2;
                faceRecs[4].x = (float)size; faceRecs[4].y = (float)size;
                faceRecs[5].x = (float)size*3; faceRecs[5].y = (float)size;
            }

            // Convert image data to 6 faces in a vertical column, that's the optimum layout for loading
            faces = GenImageColor(size, size*6, MAGENTA);
            ImageFormat(&faces, image.format);

            Image mipmapped = ImageCopy(image);
            ImageMipmaps(&mipmapped);
            ImageMipmaps(&faces);

            // NOTE: Image formatting does not work with compressed textures

            for (int i = 0; i < 6; i++) ImageDraw(&faces, mipmapped, faceRecs[i], (Rectangle){ 0, (float)size*i, (float)size, (float)size }, WHITE);

            UnloadImage(mipmapped);
        }

        // NOTE: Cubemap data is expected to be provided as 6 images in a single data array,
        // one after the other (that's a vertical image), following convention: +X, -X, +Y, -Y, +Z, -Z
        cubemap.id = rlLoadTextureCubemap(faces.data, size, faces.format, faces.mipmaps);

        if (cubemap.id != 0)
        {
            cubemap.format = faces.format;
            cubemap.mipmaps = 1;
        }
        else TRACELOG(LOG_WARNING, "IMAGE: Failed to load cubemap image");

        UnloadImage(faces);
    }
    else TRACELOG(LOG_WARNING, "IMAGE: Failed to detect cubemap image layout");

    return cubemap;
}